

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# integrators.cpp
# Opt level: O1

int pbrt::GenerateLightSubpath
              (Integrator *integrator,SampledWavelengths *lambda,SamplerHandle *sampler,
              CameraHandle *camera,ScratchBuffer *scratchBuffer,int maxDepth,Float time,
              LightSamplerHandle lightSampler,Vertex *path,bool regularize)

{
  Interval<float> IVar1;
  ulong uVar2;
  memory_resource *pmVar3;
  size_t sVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  short sVar7;
  ushort uVar8;
  undefined4 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined4 uVar12;
  undefined1 auVar13 [32];
  int iVar14;
  LightHandle *pLVar15;
  ulong uVar16;
  DebugMLTSampler *pDVar17;
  PowerLightSampler *this;
  HaltonSampler *pHVar18;
  undefined4 uVar19;
  uint *puVar21;
  undefined1 auVar22 [16];
  Float FVar23;
  undefined1 auVar24 [16];
  undefined4 extraout_XMM0_Dc;
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined1 auVar27 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [64];
  undefined1 auVar31 [64];
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Dd;
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [64];
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dd_00;
  undefined1 auVar40 [64];
  float fVar41;
  float fVar42;
  undefined1 auVar43 [16];
  undefined1 in_ZMM1 [64];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  SampledSpectrum beta;
  optional<pbrt::SampledLight> sampledLight;
  LightHandle light;
  RayDifferential ray;
  LightLeSample les;
  undefined1 local_e8 [32];
  float local_c8 [6];
  LightSamplerHandle local_b0;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  local_a8;
  TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
  local_a0;
  RayDifferential local_98;
  SampledWavelengths *pSVar20;
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [56];
  undefined1 extraout_var_02 [56];
  undefined1 extraout_var_03 [56];
  undefined1 extraout_var_04 [56];
  undefined1 extraout_var_05 [56];
  undefined1 extraout_var_06 [56];
  undefined1 extraout_var_07 [56];
  undefined1 extraout_var_08 [56];
  undefined1 extraout_var_09 [56];
  undefined1 extraout_var_10 [56];
  undefined1 extraout_var_11 [56];
  undefined1 extraout_var_12 [56];
  undefined1 extraout_var_13 [56];
  undefined1 extraout_var_14 [56];
  
  auVar22 = in_ZMM1._0_16_;
  if (maxDepth == 0) {
    return 0;
  }
  les.L.values.values._0_8_ =
       (sampler->
       super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
       ).bits;
  FVar23 = detail::DispatchSplit<8>::operator()
                     ((DispatchSplit<8> *)&ray,&les,(ulong)les.L.values.values._0_8_ >> 0x30);
  uVar2 = *(ulong *)lightSampler.
                    super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                    .bits;
  this = (PowerLightSampler *)(uVar2 & 0xffffffffffff);
  sVar7 = (short)(uVar2 >> 0x30);
  if (uVar2 >> 0x30 < 3) {
    if (sVar7 == 2) {
      PowerLightSampler::Sample(&sampledLight,this,FVar23);
      goto LAB_004041e6;
    }
LAB_0040418f:
    sVar4 = (this->lights).nStored;
    if (sVar4 == 0) {
LAB_004041d4:
      sampledLight.optionalValue._0_12_ = ZEXT412(0);
      sampledLight.optionalValue._12_4_ = 0;
      sampledLight.set = false;
      sampledLight._17_7_ = 0;
      goto LAB_004041e6;
    }
    auVar22 = vcvtusi2ss_avx512f(auVar22,sVar4);
    fVar41 = auVar22._0_4_;
    iVar14 = (int)sVar4 + -1;
    if ((int)(FVar23 * fVar41) <= iVar14) {
      iVar14 = (int)(FVar23 * fVar41);
    }
    pLVar15 = (this->lights).ptr;
  }
  else {
    if (sVar7 != 3) goto LAB_0040418f;
    pmVar3 = (this->lightToIndex).table.alloc.memoryResource;
    if (pmVar3 == (memory_resource *)0x0) goto LAB_004041d4;
    auVar22 = vcvtusi2ss_avx512f(auVar22,pmVar3);
    fVar41 = auVar22._0_4_;
    iVar14 = (int)pmVar3 + -1;
    if ((int)(FVar23 * fVar41) <= iVar14) {
      iVar14 = (int)(FVar23 * fVar41);
    }
    pLVar15 = (LightHandle *)(this->lights).nAlloc;
  }
  sampledLight.set = true;
  sampledLight.optionalValue._8_4_ = 1.0 / fVar41;
  sampledLight.optionalValue.__align =
       (anon_struct_8_0_00000001_for___align)
       pLVar15[iVar14].
       super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
       .bits;
LAB_004041e6:
  iVar14 = 0;
  if (sampledLight.set == true) {
    light.
    super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
    .bits = (TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
             )(TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
               )sampledLight.optionalValue.__align;
    uVar9 = sampledLight.optionalValue._8_4_;
    uVar2 = (sampler->
            super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
            ).bits;
    uVar8 = (ushort)(uVar2 >> 0x30);
    if (uVar2 >> 0x30 < 5) {
      pHVar18 = (HaltonSampler *)(uVar2 & 0xffffffffffff);
      if (uVar2 < 0x3000000000000) {
        if (uVar8 == 2) {
          auVar25._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar18);
          auVar25._8_56_ = extraout_var_01;
          auVar22 = auVar25._0_16_;
        }
        else {
          auVar29._0_8_ = HaltonSampler::Get2D(pHVar18);
          auVar29._8_56_ = extraout_var_05;
          auVar22 = auVar29._0_16_;
        }
      }
      else if (uVar8 == 3) {
        auVar27._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pHVar18);
        auVar27._8_56_ = extraout_var_03;
        auVar22 = auVar27._0_16_;
      }
      else {
        auVar31._0_8_ = RandomSampler::Get2D((RandomSampler *)pHVar18);
        auVar31._8_56_ = extraout_var_07;
        auVar22 = auVar31._0_16_;
      }
    }
    else {
      pDVar17 = (DebugMLTSampler *)(uVar2 & 0xffffffffffff);
      if (uVar8 < 7) {
        if (uVar8 == 6) {
          auVar26._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar17);
          auVar26._8_56_ = extraout_var_02;
          auVar22 = auVar26._0_16_;
        }
        else {
          auVar30._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar17);
          auVar30._8_56_ = extraout_var_06;
          auVar22 = auVar30._0_16_;
        }
      }
      else if (uVar8 == 7) {
        auVar28._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar17);
        auVar28._8_56_ = extraout_var_04;
        auVar22 = auVar28._0_16_;
      }
      else {
        FVar23 = DebugMLTSampler::Get1D(pDVar17);
        auVar32._0_4_ = DebugMLTSampler::Get1D(pDVar17);
        auVar32._4_60_ = extraout_var;
        auVar22._4_4_ = extraout_XMM0_Db;
        auVar22._0_4_ = FVar23;
        auVar22._8_4_ = extraout_XMM0_Dc;
        auVar22._12_4_ = extraout_XMM0_Dd;
        auVar22 = vinsertps_avx(auVar22,auVar32._0_16_,0x10);
      }
    }
    ray.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar22);
    uVar2 = (sampler->
            super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
            ).bits;
    uVar8 = (ushort)(uVar2 >> 0x30);
    if (uVar2 < 0x5000000000000) {
      pHVar18 = (HaltonSampler *)(uVar2 & 0xffffffffffff);
      if (uVar2 < 0x3000000000000) {
        if (uVar8 == 2) {
          auVar33._0_8_ = PaddedSobolSampler::Get2D((PaddedSobolSampler *)pHVar18);
          auVar33._8_56_ = extraout_var_08;
          auVar22 = auVar33._0_16_;
        }
        else {
          auVar37._0_8_ = HaltonSampler::Get2D(pHVar18);
          auVar37._8_56_ = extraout_var_12;
          auVar22 = auVar37._0_16_;
        }
      }
      else if (uVar8 == 3) {
        auVar35._0_8_ = PMJ02BNSampler::Get2D((PMJ02BNSampler *)pHVar18);
        auVar35._8_56_ = extraout_var_10;
        auVar22 = auVar35._0_16_;
      }
      else {
        auVar39._0_8_ = RandomSampler::Get2D((RandomSampler *)pHVar18);
        auVar39._8_56_ = extraout_var_14;
        auVar22 = auVar39._0_16_;
      }
    }
    else {
      pDVar17 = (DebugMLTSampler *)(uVar2 & 0xffffffffffff);
      if (uVar8 < 7) {
        if (uVar8 == 6) {
          auVar34._0_8_ = StratifiedSampler::Get2D((StratifiedSampler *)pDVar17);
          auVar34._8_56_ = extraout_var_09;
          auVar22 = auVar34._0_16_;
        }
        else {
          auVar38._0_8_ = SobolSampler::Get2D((SobolSampler *)pDVar17);
          auVar38._8_56_ = extraout_var_13;
          auVar22 = auVar38._0_16_;
        }
      }
      else if (uVar8 == 7) {
        auVar36._0_8_ = MLTSampler::Get2D((MLTSampler *)pDVar17);
        auVar36._8_56_ = extraout_var_11;
        auVar22 = auVar36._0_16_;
      }
      else {
        FVar23 = DebugMLTSampler::Get1D(pDVar17);
        auVar40._0_4_ = DebugMLTSampler::Get1D(pDVar17);
        auVar40._4_60_ = extraout_var_00;
        auVar47._4_4_ = extraout_XMM0_Db_00;
        auVar47._0_4_ = FVar23;
        auVar47._8_4_ = extraout_XMM0_Dc_00;
        auVar47._12_4_ = extraout_XMM0_Dd_00;
        auVar22 = vinsertps_avx(auVar47,auVar40._0_16_,0x10);
      }
    }
    local_e8._0_8_ = vmovlps_avx(auVar22);
    pSVar20 = lambda;
    LightHandle::SampleLe(&les,&light,(Point2f *)&ray,(Point2f *)local_e8,lambda,time);
    uVar12 = ray._40_4_;
    uVar19 = SUB84(pSVar20,0);
    if ((les.pdfPos != 0.0) || (iVar14 = 0, NAN(les.pdfPos))) {
      uVar2 = vcmpps_avx512vl(ZEXT816(0) << 0x40,ZEXT416((uint)les.pdfPos),5);
      uVar16 = vcmpps_avx512vl(ZEXT816(0) << 0x40,ZEXT416((uint)les.pdfDir),5);
      iVar14 = 0;
      if (((uVar2 & uVar16 & 1) == 0) && ((les.pdfDir != 0.0 || (NAN(les.pdfDir))))) {
        fVar41 = les.L.values.values[0];
        if ((les.L.values.values[0] == 0.0) && (!NAN(les.L.values.values[0]))) {
          uVar2 = 0;
          while (uVar16 = uVar2, uVar16 != 3) {
            fVar42 = les.L.values.values[uVar16 + 1];
            if ((fVar42 != 0.0) || (uVar2 = uVar16 + 1, NAN(fVar42))) break;
          }
          if (2 < uVar16) {
            return 0;
          }
        }
        ray.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.y =
             les.ray.d.super_Tuple3<pbrt::Vector3,_float>.y;
        ray.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
             les.ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
        ray.super_Ray.time = les.ray.time;
        uVar11 = ray.super_Ray._20_8_;
        ray.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x =
             les.ray.o.super_Tuple3<pbrt::Point3,_float>.x;
        ray.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y =
             les.ray.o.super_Tuple3<pbrt::Point3,_float>.y;
        uVar10 = ray.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_;
        ray.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.x =
             les.ray.d.super_Tuple3<pbrt::Vector3,_float>.x;
        ray.super_Ray.medium = les.ray.medium;
        ray._40_4_ = ray._40_4_ & 0xffffff00;
        ray.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
        ray.rxOrigin.super_Tuple3<pbrt::Point3,_float>._4_8_ = SUB168(ZEXT816(0) << 0x40,4);
        ray.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
        ray.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
        ray.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        ray.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
        ray.ryDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        ray.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        ray.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
        if (les.intr.set == true) {
          auVar46._8_8_ = 0;
          auVar46._0_8_ = les.intr.optionalValue.__align;
          auVar48._8_8_ = 0;
          auVar48._0_8_ = les.intr.optionalValue._8_8_;
          auVar44._8_8_ = 0;
          auVar44._0_8_ = les.intr.optionalValue._16_8_;
          local_e8._12_4_ = les.intr.optionalValue._40_4_;
          local_e8._8_4_ = les.intr.optionalValue._36_4_;
          local_e8._20_4_ = les.intr.optionalValue._48_4_;
          local_e8._16_4_ = les.intr.optionalValue._44_4_;
          local_e8._0_8_ = les.intr.optionalValue._28_8_;
          local_e8._24_8_ = les.intr.optionalValue._52_8_;
          uVar19 = les.intr.optionalValue._60_4_;
        }
        else {
          ray.super_Ray.time = les.ray.time;
          ray.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x =
               les.ray.o.super_Tuple3<pbrt::Point3,_float>.x;
          auVar46._4_4_ = ray.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
          auVar46._0_4_ = ray.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
          auVar46._8_4_ = ray.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
          auVar46._12_4_ = ray.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x;
          ray.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y =
               les.ray.o.super_Tuple3<pbrt::Point3,_float>.y;
          auVar48._4_4_ = ray.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
          auVar48._0_4_ = ray.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
          auVar48._8_4_ = ray.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
          auVar48._12_4_ = ray.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y;
          auVar44._4_4_ = les.ray.o.super_Tuple3<pbrt::Point3,_float>.z;
          auVar44._0_4_ = les.ray.o.super_Tuple3<pbrt::Point3,_float>.z;
          auVar44._8_4_ = les.ray.o.super_Tuple3<pbrt::Point3,_float>.z;
          auVar44._12_4_ = les.ray.o.super_Tuple3<pbrt::Point3,_float>.z;
          local_e8 = ZEXT1632(ZEXT816(0) << 0x40);
          auVar45._8_8_ = 0;
          auVar45._0_8_ =
               les.ray.medium.
               super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
               .bits;
          les.intr.optionalValue._64_16_ = vpslldq_avx(auVar45,8);
          les.intr.optionalValue._24_4_ = ray.super_Ray.time;
        }
        auVar13 = local_e8;
        auVar22 = vmovlhps_avx(auVar46,auVar48);
        local_c8[0] = les.L.values.values[0];
        local_c8[1] = les.L.values.values[1];
        path->type = Light;
        *(undefined8 *)(path->beta).values.values = les.L.values.values._0_8_;
        *(ulong *)((path->beta).values.values + 2) =
             CONCAT44(les.L.values.values[3],les.L.values.values[2]);
        *(undefined1 (*) [16])&path->field_2 = auVar22;
        IVar1 = (Interval<float>)vmovlps_avx(auVar44);
        (path->field_2).ei.super_Interaction.pi.super_Point3<pbrt::Interval<float>_>.
        super_Tuple3<pbrt::Point3,_pbrt::Interval<float>_>.z = IVar1;
        (path->field_2).ei.super_Interaction.time = (Float)les.intr.optionalValue._24_4_;
        (((Interaction *)&path->field_2)->wo).super_Tuple3<pbrt::Vector3,_float>.x =
             (float)local_e8._0_4_;
        (((Interaction *)&path->field_2)->wo).super_Tuple3<pbrt::Vector3,_float>.y =
             (float)local_e8._4_4_;
        *(undefined8 *)&(path->field_2).ei.super_Interaction.wo.super_Tuple3<pbrt::Vector3,_float>.z
             = local_e8._8_8_;
        (((Interaction *)&path->field_2)->n).super_Tuple3<pbrt::Normal3,_float>.y =
             (float)local_e8._16_4_;
        (((Interaction *)&path->field_2)->n).super_Tuple3<pbrt::Normal3,_float>.z =
             (float)local_e8._20_4_;
        (path->field_2).ei.super_Interaction.uv.super_Tuple2<pbrt::Point2,_float> =
             (Tuple2<pbrt::Point2,_float>)local_e8._24_8_;
        *(undefined4 *)&(path->field_2).ei.super_Interaction.field_0x3c = uVar19;
        *(undefined1 (*) [16])((long)&path->field_2 + 0x40) = les.intr.optionalValue._64_16_;
        (path->field_2).mi.phase.super_TaggedPointer<pbrt::HGPhaseFunction>.bits =
             (uintptr_t)
             light.
             super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
             .bits;
        (path->bsdf).bxdf.
        super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::BSSRDFAdapter>
        .bits = 0;
        (path->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.x = 1.0;
        (path->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        *(undefined8 *)&(path->bsdf).shadingFrame.x.super_Tuple3<pbrt::Vector3,_float>.z = 0;
        (path->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.y = 1.0;
        (path->bsdf).shadingFrame.y.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
        (path->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        (path->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        (path->bsdf).shadingFrame.z.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
        (path->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.x = 0.0;
        (path->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y = 0.0;
        *(undefined8 *)((long)&(path->bsdf).ng.super_Tuple3<pbrt::Normal3,_float>.y + 1) = 0;
        path->pdfFwd = les.pdfPos * (float)uVar9;
        path->pdfRev = 0.0;
        if (les.intr.set == true) {
          ray.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
               les.ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
          auVar22 = vfmadd132ss_fma(ZEXT416((uint)les.intr.optionalValue._44_4_),
                                    ZEXT416((uint)((float)les.intr.optionalValue._48_4_ *
                                                  ray.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>
                                                  .z)),
                                    ZEXT416((uint)les.ray.d.super_Tuple3<pbrt::Vector3,_float>.y));
          auVar47 = vfmsub213ss_fma(ZEXT416((uint)ray.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>
                                                  .z),ZEXT416((uint)les.intr.optionalValue._48_4_),
                                    ZEXT416((uint)((float)les.intr.optionalValue._48_4_ *
                                                  ray.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>
                                                  .z)));
          auVar22 = vfmadd231ss_fma(ZEXT416((uint)(auVar22._0_4_ + auVar47._0_4_)),
                                    ZEXT416((uint)les.intr.optionalValue._40_4_),
                                    ZEXT416((uint)les.ray.d.super_Tuple3<pbrt::Vector3,_float>.x));
          auVar5._8_4_ = 0x7fffffff;
          auVar5._0_8_ = 0x7fffffff7fffffff;
          auVar5._12_4_ = 0x7fffffff;
          auVar22 = vandps_avx512vl(auVar22,auVar5);
          fVar42 = auVar22._0_4_;
        }
        else {
          fVar42 = 1.0;
        }
        auVar43._0_4_ = fVar42 * fVar41;
        auVar43._4_4_ = fVar42 * les.L.values.values[1];
        auVar43._8_4_ = fVar42 * les.L.values.values[2];
        auVar43._12_4_ = fVar42 * les.L.values.values[3];
        fVar41 = les.pdfPos * (float)uVar9 * les.pdfDir;
        auVar24._4_4_ = fVar41;
        auVar24._0_4_ = fVar41;
        auVar24._8_4_ = fVar41;
        auVar24._12_4_ = fVar41;
        auVar22 = vdivps_avx(auVar43,auVar24);
        local_98.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.x =
             les.ray.o.super_Tuple3<pbrt::Point3,_float>.x;
        local_98.super_Ray.o.super_Tuple3<pbrt::Point3,_float>.y =
             les.ray.o.super_Tuple3<pbrt::Point3,_float>.y;
        local_98.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z =
             les.ray.d.super_Tuple3<pbrt::Vector3,_float>.z;
        local_98.super_Ray.time = les.ray.time;
        local_98.super_Ray.medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = les.ray.medium.
                super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
                .bits;
        local_98._40_8_ = (ulong)(uint)uVar12 & 0xffffffffffffff00;
        local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y =
             ray.rxOrigin.super_Tuple3<pbrt::Point3,_float>.y;
        local_98.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z =
             ray.rxOrigin.super_Tuple3<pbrt::Point3,_float>.z;
        local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x = 0.0;
        local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        local_98.rxDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
        local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
        local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
        local_98.ryDirection.super_Tuple3<pbrt::Vector3,_float>.z = 0.0;
        local_a0.bits =
             (sampler->
             super_TaggedPointer<pbrt::HaltonSampler,_pbrt::PaddedSobolSampler,_pbrt::PMJ02BNSampler,_pbrt::RandomSampler,_pbrt::SobolSampler,_pbrt::StratifiedSampler,_pbrt::MLTSampler,_pbrt::DebugMLTSampler>
             ).bits;
        local_a8.bits =
             (camera->
             super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
             ).bits;
        auVar47 = vshufpd_avx(auVar22,auVar22,1);
        beta.values.values._0_8_ = auVar22._0_8_;
        beta.values.values._8_8_ = auVar47._0_8_;
        ray.super_Ray.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = uVar10;
        ray.super_Ray._20_8_ = uVar11;
        ray.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y =
             ray.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x;
        ray.rxDirection.super_Tuple3<pbrt::Vector3,_float>.y =
             ray.ryOrigin.super_Tuple3<pbrt::Point3,_float>.x;
        local_e8 = auVar13;
        local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.y =
             ray.rxOrigin.super_Tuple3<pbrt::Point3,_float>.x;
        local_98.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z =
             ray.ryOrigin.super_Tuple3<pbrt::Point3,_float>.z;
        iVar14 = RandomWalk(integrator,lambda,&local_98,(SamplerHandle *)&local_a0,
                            (CameraHandle *)&local_a8,scratchBuffer,beta,les.pdfDir,maxDepth + -1,
                            Importance,path + 1,regularize);
        if ((path->type == Light) &&
           ((puVar21 = (uint *)((ulong)(path->field_2).ei.field_0 & 0xffffffffffff),
            puVar21 == (uint *)0x0 || ((*puVar21 & 0xfffffffd) == 1)))) {
          if (0 < iVar14) {
            path[1].pdfFwd = les.pdfPos;
            fVar41 = path[1].field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.x;
            if ((((fVar41 != 0.0) ||
                 (fVar42 = path[1].field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>
                           .y, fVar42 != 0.0)) || (NAN(fVar42))) ||
               ((fVar42 = path[1].field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.
                          z, fVar42 != 0.0 || (NAN(fVar42))))) {
              fVar42 = path[1].field_2.ei.super_Interaction.n.super_Tuple3<pbrt::Normal3,_float>.z;
              auVar47 = ZEXT416((uint)(fVar42 * ray.super_Ray.d.super_Tuple3<pbrt::Vector3,_float>.z
                                      ));
              auVar22 = vfmadd132ss_fma(ZEXT416((uint)path[1].field_2.ei.super_Interaction.n.
                                                      super_Tuple3<pbrt::Normal3,_float>.y),auVar47,
                                        ZEXT416((uint)ray.super_Ray.d.
                                                      super_Tuple3<pbrt::Vector3,_float>.y));
              auVar47 = vfmsub213ss_fma(ZEXT416((uint)ray.super_Ray.d.
                                                      super_Tuple3<pbrt::Vector3,_float>.z),
                                        ZEXT416((uint)fVar42),auVar47);
              auVar22 = vfmadd231ss_fma(ZEXT416((uint)(auVar22._0_4_ + auVar47._0_4_)),
                                        ZEXT416((uint)fVar41),
                                        ZEXT416((uint)ray.super_Ray.d.
                                                      super_Tuple3<pbrt::Vector3,_float>.x));
              auVar6._8_4_ = 0x7fffffff;
              auVar6._0_8_ = 0x7fffffff7fffffff;
              auVar6._12_4_ = 0x7fffffff;
              auVar22 = vandps_avx512vl(auVar22,auVar6);
              path[1].pdfFwd = les.pdfPos * auVar22._0_4_;
            }
          }
          local_b0.
          super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
          .bits = *(TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                    *)lightSampler.
                      super_TaggedPointer<pbrt::UniformLightSampler,_pbrt::PowerLightSampler,_pbrt::BVHLightSampler,_pbrt::ExhaustiveLightSampler>
                      .bits;
          FVar23 = InfiniteLightDensity(&integrator->infiniteLights,&local_b0,&ray.super_Ray.d);
          path->pdfFwd = FVar23;
        }
        iVar14 = iVar14 + 1;
      }
    }
  }
  return iVar14;
}

Assistant:

int GenerateLightSubpath(const Integrator &integrator, SampledWavelengths &lambda,
                         SamplerHandle sampler, CameraHandle camera,
                         ScratchBuffer &scratchBuffer, int maxDepth, Float time,
                         LightSamplerHandle lightSampler, Vertex *path, bool regularize) {
    if (maxDepth == 0)
        return 0;
    // Sample initial ray for light subpath
    pstd::optional<SampledLight> sampledLight = lightSampler.Sample(sampler.Get1D());
    if (!sampledLight)
        return 0;
    LightHandle light = sampledLight->light;
    Float lightPDF = sampledLight->pdf;
    LightLeSample les = light.SampleLe(sampler.Get2D(), sampler.Get2D(), lambda, time);
    if (!les || les.pdfPos == 0 || les.pdfDir == 0 || !les.L)
        return 0;
    RayDifferential ray(les.ray);

    // Generate first vertex on light subpath and start random walk
    path[0] = les.intr ? Vertex::CreateLight(light, ray, *les.intr, les.L,
                                             les.pdfPos * lightPDF)
                       : Vertex::CreateLight(light, ray, les.L, les.pdfPos * lightPDF);
    SampledSpectrum beta =
        les.L * les.AbsCosTheta(ray.d) / (lightPDF * les.pdfPos * les.pdfDir);
    PBRT_DBG("%s\n",
             StringPrintf(
                 "Starting light subpath. Ray: %s, Le %s, beta %s, pdfPos %f, pdfDir %f",
                 ray, les.L, beta, les.pdfPos, les.pdfDir)
                 .c_str());
    int nVertices = RandomWalk(integrator, lambda, ray, sampler, camera, scratchBuffer,
                               beta, les.pdfDir, maxDepth - 1, TransportMode::Importance,
                               path + 1, regularize);
    // Correct subpath sampling densities for infinite area lights
    if (path[0].IsInfiniteLight()) {
        // Set spatial density of _path[1]_ for infinite area light
        if (nVertices > 0) {
            path[1].pdfFwd = les.pdfPos;
            if (path[1].IsOnSurface())
                path[1].pdfFwd *= AbsDot(ray.d, path[1].ng());
        }

        // Set spatial density of _path[0]_ for infinite area light
        path[0].pdfFwd =
            InfiniteLightDensity(integrator.infiniteLights, lightSampler, ray.d);
    }

    return nVertices + 1;
}